

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

void __thiscall re2::DFA::StateToWorkq(DFA *this,State *s,Workq *q)

{
  int local_24;
  int i;
  Workq *q_local;
  State *s_local;
  DFA *this_local;
  
  Workq::clear(q);
  for (local_24 = 0; local_24 < s->ninst_; local_24 = local_24 + 1) {
    if (s->inst_[local_24] == -1) {
      Workq::mark(q);
    }
    else {
      AddToQueue(this,q,s->inst_[local_24],s->flag_ & 0xfff);
    }
  }
  return;
}

Assistant:

void DFA::StateToWorkq(State* s, Workq* q) {
  q->clear();
  for (int i = 0; i < s->ninst_; i++) {
    if (s->inst_[i] == Mark)
      q->mark();
    else
      // Explore from the head of the list.
      AddToQueue(q, s->inst_[i], s->flag_ & kFlagEmptyMask);
  }
}